

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_for.hpp
# Opt level: O0

void Omega_h::
     parallel_for<Omega_h::assemble_slices(std::shared_ptr<Omega_h::Comm>,Omega_h_Family,int,long,long,Omega_h::Read<long>,long,long,Omega_h::Read<double>,Omega_h::Dist*,Omega_h::Read<int>*,Omega_h::Dist*)::__0>
               (LO n,type *f,char *name)

{
  undefined1 local_70 [8];
  type f2;
  IntIterator last;
  IntIterator first;
  char *name_local;
  type *f_local;
  LO n_local;
  
  f2.slice_elem_vert_coords.write_.shared_alloc_.direct_ptr._4_4_ = 0;
  f2.slice_elem_vert_coords.write_.shared_alloc_.direct_ptr._0_4_ = n;
  assemble_slices(std::shared_ptr<Omega_h::Comm>,Omega_h_Family,int,long,long,Omega_h::Read<long>,long,long,Omega_h::Read<double>,Omega_h::Dist*,Omega_h::Read<int>*,Omega_h::Dist*)
  ::$_0::__0((__0 *)local_70,f);
  for_each<Omega_h::IntIterator,Omega_h::assemble_slices(std::shared_ptr<Omega_h::Comm>,Omega_h_Family,int,long,long,Omega_h::Read<long>,long,long,Omega_h::Read<double>,Omega_h::Dist*,Omega_h::Read<int>*,Omega_h::Dist*)::__0>
            (f2.slice_elem_vert_coords.write_.shared_alloc_.direct_ptr._4_4_,
             f2.slice_elem_vert_coords.write_.shared_alloc_.direct_ptr._0_4_,(type *)local_70);
  assemble_slices(std::shared_ptr<Omega_h::Comm>,Omega_h_Family,int,long,long,Omega_h::Read<long>,long,long,Omega_h::Read<double>,Omega_h::Dist*,Omega_h::Read<int>*,Omega_h::Dist*)
  ::$_0::~__0((__0 *)local_70);
  return;
}

Assistant:

void parallel_for(LO n, T const& f, char const* name = "") {
#if defined(OMEGA_H_USE_KOKKOS)
  if (n > 0) Kokkos::parallel_for(name, policy(n), f);
#else
  (void)name;
  auto const first = IntIterator(0);
  auto const last = IntIterator(n);
  auto f2 = f;
  ::Omega_h::for_each(first, last, std::move(f2));
#endif
}